

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall
Fad<double>::Fad<FadFuncAtan<Fad<double>>>
          (Fad<double> *this,FadExpr<FadFuncAtan<Fad<double>_>_> *fadexpr)

{
  int iVar1;
  FadSuper *in_RDI;
  value_type vVar2;
  int i;
  int sz;
  double *in_stack_ffffffffffffff98;
  FadExpr<FadFuncAtan<Fad<double>_>_> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffdc;
  int i_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  FadSuper::FadSuper(in_RDI);
  vVar2 = FadExpr<FadFuncAtan<Fad<double>_>_>::val((FadExpr<FadFuncAtan<Fad<double>_>_> *)0x1eabd2f)
  ;
  *(value_type *)in_RDI = vVar2;
  FadExpr<FadFuncAtan<Fad<double>_>_>::size((FadExpr<FadFuncAtan<Fad<double>_>_> *)0x1eabd5e);
  Vector<double>::Vector
            ((Vector<double> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  iVar1 = FadExpr<FadFuncAtan<Fad<double>_>_>::size
                    ((FadExpr<FadFuncAtan<Fad<double>_>_> *)0x1eabd8b);
  if (iVar1 != 0) {
    for (i_00 = 0; i_00 < iVar1; i_00 = i_00 + 1) {
      in_stack_ffffffffffffffa0 =
           (FadExpr<FadFuncAtan<Fad<double>_>_> *)
           FadExpr<FadFuncAtan<Fad<double>_>_>::dx
                     (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      in_stack_ffffffffffffff98 = Vector<double>::operator[]((Vector<double> *)(in_RDI + 8),i_00);
      *in_stack_ffffffffffffff98 = (double)in_stack_ffffffffffffffa0;
    }
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }